

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorUtils-inl.hpp
# Opt level: O1

Result * __thiscall
CoreML::
validateDescriptionsAreAllVectorizableTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
          (Result *__return_storage_ptr__,CoreML *this,
          RepeatedPtrField<CoreML::Specification::FeatureDescription> *features)

{
  bool bVar1;
  Type *featureDesc;
  int index;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  allocator_type local_7d;
  TypeCase local_7c [3];
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_70;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  Result::Result(__return_storage_ptr__);
  if (0 < *(int *)(this + 8)) {
    index = 0;
    do {
      local_7c[0] = kDoubleType;
      local_7c[1] = kInt64Type;
      local_7c[2] = 5;
      __l._M_len = 3;
      __l._M_array = local_7c;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector(&local_70,__l,&local_7d);
      featureDesc = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                              ((RepeatedPtrFieldBase *)this,index);
      validateSchemaTypes((Result *)local_58,&local_70,featureDesc);
      __return_storage_ptr__->m_type = local_58._0_4_;
      __return_storage_ptr__->m_reason = local_58._4_4_;
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->m_message,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_p != &local_40) {
        operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
      }
      if (local_70.
          super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_70.
                        super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_70.
                              super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_70.
                              super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      bVar1 = Result::good(__return_storage_ptr__);
    } while ((bVar1) && (index = index + 1, index < *(int *)(this + 8)));
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateDescriptionsAreAllVectorizableTypes(const Descriptions &features) {
        Result result;
        for (int i = 0; i < features.size(); i++) {
            result = validateSchemaTypes({
                Specification::FeatureType::kDoubleType,
                Specification::FeatureType::kInt64Type,
                Specification::FeatureType::kMultiArrayType,
            }, features[i]);
            if (!result.good()) {
                return result;
            }
        }

        return result;
    }